

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_mel_cepstral_analysis.cc
# Opt level: O2

bool anon_unknown.dwarf_fff9::CoefficientsFrequencyTransform
               (vector<double,_std::allocator<double>_> *input,int input_length,int output_length,
               int fft_length,double alpha,double theta,
               vector<double,_std::allocator<double>_> *output,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *buffer)

{
  pointer pdVar1;
  double *pdVar2;
  pointer pvVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  size_t __n;
  double *pdVar10;
  int j;
  ulong uVar11;
  double dVar12;
  double *pdVar13;
  size_type sVar14;
  size_type __new_size;
  ulong uVar15;
  double dVar16;
  allocator_type local_f1;
  double local_f0;
  size_type local_e8;
  double local_e0;
  double local_d8;
  size_type local_d0;
  int local_c4;
  vector<double,_std::allocator<double>_> ww;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  InverseFastFourierTransform inverse_fourier_transform;
  
  sVar14 = (size_type)output_length;
  local_f0 = alpha;
  local_d8 = theta;
  if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != sVar14) {
    std::vector<double,_std::allocator<double>_>::resize(output,sVar14);
  }
  __new_size = (size_type)input_length;
  if ((((local_f0 != 0.0) || (NAN(local_f0))) || (local_d8 != 0.0)) || (NAN(local_d8))) {
    if (((long)(buffer->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 == sVar14) {
      uVar4 = 0;
      if (0 < output_length) {
        uVar4 = output_length;
      }
      dVar12 = (double)(ulong)uVar4;
    }
    else {
      local_e8 = (size_type)fft_length;
      local_d0 = sVar14;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&inverse_fourier_transform,local_e8,
                 (allocator_type *)&imag);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&real,local_d0,(value_type *)&inverse_fourier_transform,(allocator_type *)&ww);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&inverse_fourier_transform);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&inverse_fourier_transform,local_e8,
                 (allocator_type *)&ww);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&imag,local_d0,(value_type *)&inverse_fourier_transform,&local_f1);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&inverse_fourier_transform);
      std::vector<double,_std::allocator<double>_>::vector
                (&ww,local_e8,(allocator_type *)&inverse_fourier_transform);
      local_e0 = 6.283185307179586 / (double)fft_length;
      uVar11 = 0;
      uVar15 = 0;
      local_c4 = fft_length;
      if (0 < fft_length) {
        uVar15 = (ulong)(uint)fft_length;
      }
      for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
        dVar9 = sptk::Warp((double)(int)uVar11 * local_e0,local_f0,local_d8);
        ww.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] = dVar9;
      }
      sptk::InverseFastFourierTransform::InverseFastFourierTransform
                (&inverse_fourier_transform,local_c4);
      bVar5 = false;
      local_e0 = (double)(ulong)(uint)output_length;
      if (output_length < 1) {
        local_e0 = 0.0;
      }
      local_e8 = local_e8 - 1;
      dVar9 = 0.0;
      while (dVar9 != local_e0) {
        local_f0 = (double)SUB84(dVar9,0);
        local_d8 = dVar9;
        for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
          dVar12 = cos(ww.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11] * local_f0);
          real.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)dVar9].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] = dVar12;
          dVar12 = sin(ww.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11] * local_f0);
          imag.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)dVar9].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] = -dVar12;
        }
        bVar6 = sptk::InverseFastFourierTransform::Run
                          (&inverse_fourier_transform,
                           real.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)dVar9,
                           imag.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)dVar9);
        if (!bVar6) {
          bVar5 = true;
          dVar9 = local_d8;
          break;
        }
        sVar14 = local_e8;
        for (lVar8 = 1; lVar8 < (long)__new_size; lVar8 = lVar8 + 1) {
          pdVar7 = real.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar9].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7[lVar8] = pdVar7[sVar14] + pdVar7[lVar8];
          sVar14 = sVar14 + -1;
        }
        dVar9 = (double)((long)local_d8 + 1);
      }
      dVar12 = local_e0;
      sptk::InverseFastFourierTransform::~InverseFastFourierTransform(&inverse_fourier_transform);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ww.super__Vector_base<double,_std::allocator<double>_>);
      if ((long)local_d0 <= (long)dVar9) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(buffer,local_d0);
        bVar5 = false;
        uVar11 = (ulong)(uint)input_length;
        if (input_length < 1) {
          uVar11 = 0;
        }
        for (dVar9 = 0.0; dVar9 != dVar12; dVar9 = (double)((long)dVar9 + 1)) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((buffer->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + (long)dVar9,__new_size);
          for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
            *(double *)
             (*(long *)&(buffer->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[(long)dVar9].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar15 * 8) =
                 real.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)dVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15];
          }
        }
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&imag);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&real);
      if (bVar5) {
        return false;
      }
    }
    pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (dVar9 = 0.0; dVar9 != dVar12; dVar9 = (double)((long)dVar9 + 1)) {
      pvVar3 = (buffer->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar16 = 0.0;
      pdVar13 = pdVar2;
      for (pdVar10 = pvVar3[(long)dVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
          pdVar10 !=
          *(pointer *)
           ((long)&pvVar3[(long)dVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8); pdVar10 = pdVar10 + 1) {
        dVar16 = dVar16 + *pdVar10 * *pdVar13;
        pdVar13 = pdVar13 + 1;
      }
      (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)dVar9] = dVar16;
    }
  }
  else {
    if (output_length <= input_length) {
      if (output_length == 0) {
        return true;
      }
      memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,
              (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,sVar14 << 3);
      return true;
    }
    pdVar1 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
    if (__n != 0) {
      memmove(pdVar7,pdVar1,__n);
      pdVar7 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar1 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar7 = pdVar7 + __new_size; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
      *pdVar7 = 0.0;
    }
  }
  return true;
}

Assistant:

bool CoefficientsFrequencyTransform(const std::vector<double>& input,
                                    int input_length, int output_length,
                                    int fft_length, double alpha, double theta,
                                    std::vector<double>* output,
                                    std::vector<std::vector<double> >* buffer) {
  if (output->size() != static_cast<std::size_t>(output_length)) {
    output->resize(output_length);
  }

  if (0.0 == alpha && 0.0 == theta) {
    if (input_length < output_length) {
      std::copy(input.begin(), input.end(), output->begin());
      std::fill(output->begin() + input_length, output->end(), 0.0);
    } else {
      std::copy(input.begin(), input.begin() + output_length, output->begin());
    }
    return true;
  }

  if (buffer->size() != static_cast<std::size_t>(output_length)) {
    std::vector<std::vector<double> > real(output_length,
                                           std::vector<double>(fft_length));
    std::vector<std::vector<double> > imag(output_length,
                                           std::vector<double>(fft_length));
    {
      std::vector<double> ww(fft_length);
      {
        const double delta(sptk::kTwoPi / fft_length);
        for (int j(0); j < fft_length; ++j) {
          ww[j] = sptk::Warp(delta * j, alpha, theta);
        }
      }

      sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
      for (int m(0); m < output_length; ++m) {
        for (int j(0); j < fft_length; ++j) {
          real[m][j] = std::cos(ww[j] * m);
          imag[m][j] = -std::sin(ww[j] * m);
        }

        if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
          return false;
        }

        for (int j(1); j < input_length; ++j) {
          real[m][j] += real[m][fft_length - j];
        }
      }
    }

    buffer->resize(output_length);
    for (int m2(0); m2 < output_length; ++m2) {
      (*buffer)[m2].resize(input_length);
      for (int m1(0); m1 < input_length; ++m1) {
        (*buffer)[m2][m1] = real[m2][m1];
      }
    }
  }

  for (int m2(0); m2 < output_length; ++m2) {
    (*output)[m2] = std::inner_product((*buffer)[m2].begin(),
                                       (*buffer)[m2].end(), input.begin(), 0.0);
  }

  return true;
}